

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_mqtt_next_subscribe_topic(mg_mqtt_message *msg,mg_str *topic,uint8_t *qos,int pos)

{
  char *pcVar1;
  uchar *buf;
  int pos_local;
  uint8_t *qos_local;
  mg_str *topic_local;
  mg_mqtt_message *msg_local;
  
  pcVar1 = (msg->payload).p + pos;
  if ((ulong)(long)pos < (msg->payload).len) {
    topic->len = (long)(int)(uint)CONCAT11(*pcVar1,pcVar1[1]);
    topic->p = pcVar1 + 2;
    *qos = pcVar1[topic->len + 2];
    msg_local._4_4_ = pos + (int)topic->len + 3;
  }
  else {
    msg_local._4_4_ = -1;
  }
  return msg_local._4_4_;
}

Assistant:

int mg_mqtt_next_subscribe_topic(struct mg_mqtt_message *msg,
                                 struct mg_str *topic, uint8_t *qos, int pos) {
    unsigned char *buf = (unsigned char *) msg->payload.p + pos;
    if ((size_t) pos >= msg->payload.len) {
        return -1;
    }

    topic->len = buf[0] << 8 | buf[1];
    topic->p = (char *) buf + 2;
    *qos = buf[2 + topic->len];
    return pos + 2 + topic->len + 1;
}